

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qclipboard.cpp
# Opt level: O0

QString * __thiscall QClipboard::text(QClipboard *this,QString *subtype,Mode mode)

{
  bool bVar1;
  QMimeData *ba;
  ulong uVar2;
  Encoding *pEVar3;
  QString *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QString *format;
  QStringList *__range3;
  QMimeData *data;
  QByteArray rawData;
  const_iterator __end3;
  const_iterator __begin3;
  QStringList formats;
  optional<QStringConverter::Encoding> encoding;
  undefined4 in_stack_fffffffffffffe18;
  Flag in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  Mode in_stack_fffffffffffffe24;
  Encoding EVar5;
  QClipboard *in_stack_fffffffffffffe28;
  QFlagsStorage<QStringConverterBase::Flag> flags;
  EncodedData<const_QByteArray_&> *in_stack_fffffffffffffe30;
  QString *this_00;
  QLatin1String *local_190;
  QByteArrayView local_128;
  QByteArray local_d8;
  QLatin1StringView local_c0;
  QString *local_80;
  const_iterator local_78;
  const_iterator local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  QStringDecoder local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  ba = mimeData(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  if (ba == (QMimeData *)0x0) {
    QString::QString((QString *)0x33e9f3);
    goto LAB_0033ee79;
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)ba + 0x68))(&local_68);
  bVar1 = QString::isEmpty((QString *)0x33ea45);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffe28,
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    QVar4.m_data = (char *)in_RDI;
    QVar4.m_size = (qsizetype)in_stack_fffffffffffffe30;
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),QVar4,
                       CaseInsensitive);
    if (bVar1) {
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffe28,
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      local_190 = (QLatin1String *)QVar4.m_size;
      QString::operator=(in_RDX,local_190);
    }
    else {
      local_70.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_70 = QList<QString>::begin
                           ((QList<QString> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      local_78.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = QList<QString>::end((QList<QString> *)
                                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      while( true ) {
        local_80 = local_78.i;
        bVar1 = QList<QString>::const_iterator::operator!=(&local_70,local_78);
        if (!bVar1) break;
        in_stack_fffffffffffffe30 =
             (EncodedData<const_QByteArray_&> *)QList<QString>::const_iterator::operator*(&local_70)
        ;
        QVar4 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffe28,
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        uVar2 = QString::startsWith((QLatin1String *)in_stack_fffffffffffffe30,
                                    (CaseSensitivity)QVar4.m_size);
        if ((uVar2 & 1) != 0) {
          QString::sliced(this_00,(qsizetype)in_RDI);
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          QString::~QString((QString *)0x33ebec);
          break;
        }
        QList<QString>::const_iterator::operator++(&local_70);
      }
      bVar1 = QString::isEmpty((QString *)0x33ec0f);
      if (bVar1) {
        QString::QString((QString *)0x33ec1f);
        goto LAB_0033ee6c;
      }
    }
LAB_0033eca4:
    local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)ba,CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    ::operator+((QLatin1String *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                (QString *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QLatin1String,_QString_&> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    QMimeData::data((QString *)&local_d8);
    QString::~QString((QString *)0x33ed55);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<QByteArray,_true>
              ((QByteArrayView *)in_stack_fffffffffffffe30,(QByteArray *)ba);
    flags.i = (Int)((ulong)ba >> 0x20);
    local_48 = (undefined1 *)QStringConverter::encodingForData(local_128,L'\0');
    bVar1 = std::optional::operator_cast_to_bool((optional<QStringConverter::Encoding> *)0x33eda5);
    if (!bVar1) {
      std::optional<QStringConverter::Encoding>::optional<QStringConverter::Encoding,_true>
                ((optional<QStringConverter::Encoding> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (Encoding *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_48 = (undefined1 *)local_50;
    }
    pEVar3 = std::optional<QStringConverter::Encoding>::operator*
                       ((optional<QStringConverter::Encoding> *)0x33ede6);
    EVar5 = *pEVar3;
    QFlags<QStringConverterBase::Flag>::QFlags
              ((QFlags<QStringConverterBase::Flag> *)CONCAT44(EVar5,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c);
    QStringDecoder::QStringDecoder
              ((QStringDecoder *)CONCAT44(EVar5,in_stack_fffffffffffffe20),in_stack_fffffffffffffe1c
               ,(Flags)flags.i);
    QStringDecoder::decode<void>(&local_40,&local_d8);
    QStringDecoder::EncodedData::operator_cast_to_QString(in_stack_fffffffffffffe30);
    QStringDecoder::~QStringDecoder((QStringDecoder *)0x33ee57);
    QByteArray::~QByteArray((QByteArray *)0x33ee6c);
  }
  else {
    local_c0 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffe28,
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    ::operator+((QLatin1String *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                (QString *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    bVar1 = QListSpecialMethodsBase<QString>::contains<QStringBuilder<QLatin1String,QString&>>
                      ((QListSpecialMethodsBase<QString> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (QStringBuilder<QLatin1String,_QString_&> *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0033eca4;
    QString::QString((QString *)0x33ec95);
  }
LAB_0033ee6c:
  QList<QString>::~QList((QList<QString> *)0x33ee79);
LAB_0033ee79:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QString QClipboard::text(QString &subtype, Mode mode) const
{
    const QMimeData *const data = mimeData(mode);
    if (!data)
        return QString();

    const QStringList formats = data->formats();
    if (subtype.isEmpty()) {
        if (formats.contains("text/plain"_L1))
            subtype = "plain"_L1;
        else {
            for (const auto &format : formats) {
                if (format.startsWith("text/"_L1)) {
                    subtype = format.sliced(5);
                    break;
                }
            }
            if (subtype.isEmpty())
                return QString();
        }
    } else if (!formats.contains("text/"_L1 + subtype)) {
        return QString();
    }

    const QByteArray rawData = data->data("text/"_L1 + subtype);
    auto encoding = QStringConverter::encodingForData(rawData);
    if (!encoding)
        encoding = QStringConverter::Utf8;
    return QStringDecoder(*encoding).decode(rawData);
}